

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,string *name,
          shared_ptr<helics::Broker> *obj,CoreType type)

{
  int iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>,_bool>
  pVar2;
  initializer_list<helics::CoreType> __l;
  allocator_type local_49;
  vector<helics::CoreType,_std::allocator<helics::CoreType>_> local_48;
  CoreType local_2c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<helics::Broker>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>>
                        *)(this + 0x28),name,obj);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __l._M_len = 1;
      __l._M_array = &local_2c;
      local_2c = type;
      std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>::vector
                (&local_48,__l,&local_49);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
      ::
      _M_emplace_unique<std::__cxx11::string_const&,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
                  *)(this + 0x58),name,&local_48);
      if (local_48.super__Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<helics::CoreType,_std::allocator<helics::CoreType>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return (bool)(pVar2.second & 1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool addObject(const std::string& name, std::shared_ptr<X> obj, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto res = objectMap.emplace(name, std::move(obj));
        if (res.second) {
            typeMap.emplace(name, std::vector<Y>{type});
        }
        return res.second;
    }